

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpinternalsourcedata.h
# Opt level: O1

int __thiscall
jrtplib::RTPInternalSourceData::SetRTPDataAddress(RTPInternalSourceData *this,RTPAddress *a)

{
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  int iVar3;
  undefined4 extraout_var;
  RTPAddress *pRVar4;
  
  if (a == (RTPAddress *)0x0) {
    pRVar4 = (this->super_RTPSourceData).rtpaddr;
    if (pRVar4 != (RTPAddress *)0x0) {
      pRVar2 = (this->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        (*pRVar4->_vptr_RTPAddress[4])(pRVar4);
      }
      else {
        (*pRVar4->_vptr_RTPAddress[3])(pRVar4);
        (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar4);
      }
      (this->super_RTPSourceData).rtpaddr = (RTPAddress *)0x0;
    }
  }
  else {
    iVar3 = (**a->_vptr_RTPAddress)(a,(this->super_RTPSourceData).super_RTPMemoryObject.mgr);
    pRVar4 = (RTPAddress *)CONCAT44(extraout_var,iVar3);
    if (pRVar4 == (RTPAddress *)0x0) {
      return -1;
    }
    pRVar1 = (this->super_RTPSourceData).rtpaddr;
    if (pRVar1 != a && pRVar1 != (RTPAddress *)0x0) {
      pRVar2 = (this->super_RTPSourceData).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
      }
      else {
        (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
        (*pRVar2->_vptr_RTPMemoryManager[3])(pRVar2,pRVar1);
      }
    }
    (this->super_RTPSourceData).rtpaddr = pRVar4;
    if (pRVar4 == (RTPAddress *)0x0) {
      return -1;
    }
  }
  (this->super_RTPSourceData).isrtpaddrset = true;
  return 0;
}

Assistant:

inline int RTPInternalSourceData::SetRTPDataAddress(const RTPAddress *a)
{
	if (a == 0)
	{
		if (rtpaddr)
		{
			RTPDelete(rtpaddr,GetMemoryManager());
			rtpaddr = 0;
		}
	}
	else
	{
		RTPAddress *newaddr = a->CreateCopy(GetMemoryManager());
		if (newaddr == 0)
			return ERR_RTP_OUTOFMEM;
		
		if (rtpaddr && a != rtpaddr)
			RTPDelete(rtpaddr,GetMemoryManager());
		rtpaddr = newaddr;
	}
	isrtpaddrset = true;
	return 0;
}